

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                *matrix)

{
  uint uVar1;
  pointer pNVar2;
  pointer ppEVar3;
  key_type *pkVar4;
  pointer ppEVar5;
  int iVar6;
  pointer ppEVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  *p_Var11;
  bool bVar12;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
  pVar13;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  undefined8 local_440;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_3;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  col3;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  col4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_5;
  undefined4 *local_348;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  *local_340;
  char *local_338;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
  *local_330;
  char *local_328;
  shared_count sStack_320;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  col2;
  long local_2d0;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  col1;
  Column_settings settings;
  undefined4 local_254;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>
  col0;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  col1.super_Row_access_option.columnIndex_ = 0;
  col1.super_Row_access_option._4_4_ = 4;
  col1.super_Row_access_option.rows_._0_4_ = 1;
  col1.super_Row_access_option.rows_._4_4_ = 2;
  col1.super_Column_dimension_option.dim_ = 2;
  col1._20_4_ = 1;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 1;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000006;
  __l._M_len = 5;
  __l._M_array = (iterator)&col1;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col2,__l,(allocator_type *)&col3);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  Naive_vector_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)&col0,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col2,&settings);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
                    col2.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  _add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&col0);
  col1.super_Column_dimension_option.dim_ = 0;
  col1._20_4_ = 0;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  col1.super_Row_access_option.columnIndex_ = 0;
  col1.super_Row_access_option._4_4_ = 4;
  col1.super_Row_access_option.rows_._0_4_ = 1;
  col1.super_Row_access_option.rows_._4_4_ = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col1);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x386);
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    ppEVar7 = *(pointer *)
               ((long)&(pNVar2->column_).
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar7 !=
        (pNVar2->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = ppEVar7[-1]->rowIndex_ + 1;
      goto LAB_0017229f;
    }
    col3.super_Row_access_option.columnIndex_ = 0;
    col3.super_Row_access_option._4_4_ = 0;
    col3.super_Row_access_option.rows_._0_4_ = 0;
    col3.super_Row_access_option.rows_._4_4_ = 0;
    col3.super_Column_dimension_option.dim_ = 0;
    col3._20_4_ = 0;
  }
  else {
LAB_0017229f:
    col1.super_Row_access_option.columnIndex_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,(long)(int)uVar10,
               (value_type_conflict1 *)&col1,(allocator_type *)&col4);
    ppEVar3 = *(pointer *)
               ((long)&(pNVar2->column_).
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    for (ppEVar7 = (pNVar2->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
        ppEVar7 = ppEVar7 + 1) {
      uVar1 = (*ppEVar7)->rowIndex_;
      if (uVar10 <= uVar1) break;
      *(uint *)(col3.super_Row_access_option._0_8_ + (ulong)uVar1 * 4) =
           ((*ppEVar7)->super_Entry_field_element_option).element_;
    }
  }
  sVar8 = CONCAT44(col3.super_Row_access_option.rows_._4_4_,(uint)col3.super_Row_access_option.rows_
                  ) - col3.super_Row_access_option._0_8_;
  if (sVar8 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if (CONCAT44(col3.super_Row_access_option.rows_._4_4_,(uint)col3.super_Row_access_option.rows_)
        == col3.super_Row_access_option._0_8_) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp((void *)col3.super_Row_access_option._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  col2.super_Row_access_option.columnIndex_._0_1_ = bVar12;
  col2.super_Row_access_option.rows_._0_4_ = 0;
  col2.super_Row_access_option.rows_._4_4_ = 0;
  col2.super_Column_dimension_option.dim_ = 0;
  col2._20_4_ = 0;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&col4;
  col4.super_Row_access_option._0_8_ = anon_var_dwarf_d82c9;
  col4.super_Row_access_option.rows_._0_4_ = 0x2077fa;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col1.super_Row_access_option.rows_._0_4_ = (uint)col1.super_Row_access_option.rows_ & 0xffffff00;
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483a0;
  col1.super_Column_dimension_option.dim_ = 0x250128;
  col1._20_4_ = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&col2,&col1,&local_60,0x386,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col2.super_Column_dimension_option);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x388);
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00248430;
  col3.super_Column_dimension_option.dim_ = 0x250128;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x201316;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)*(pointer *)
                 ((long)&(pNVar2->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                         ._M_impl + 8) -
          *(long *)&(pNVar2->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data;
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)(lVar9 >> 3);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_330;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_340;
  col4.super_Row_access_option.columnIndex_._0_1_ = lVar9 == 0x20;
  local_340 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)CONCAT44(local_340._4_4_,4);
  col4.super_Row_access_option.rows_._0_4_ = 0;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_bfd12;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x201afc;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_4;
  col1.super_Row_access_option.rows_._0_4_ = (uint)col1.super_Row_access_option.rows_ & 0xffffff00;
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483f0;
  col1.super_Column_dimension_option.dim_ = 0x250128;
  col1._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_5;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002486b0;
  col2.super_Column_dimension_option.dim_ = 0x250128;
  col2._20_4_ = 0;
  boost::test_tools::tt_detail::report_assertion
            (&col4,&col3,&container_3,0x388,1,2,2,"matrix[0].size()",&col1,"4",&col2);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_._0_4_ = 1;
  col2.super_Row_access_option.rows_._4_4_ = 3;
  col2.super_Column_dimension_option.dim_ = 2;
  col2._20_4_ = 4;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 4;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000006;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col3,__l_00,(allocator_type *)&col4);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  Naive_vector_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)&col1,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  _add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&col1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,0,0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x38f);
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    ppEVar7 = *(pointer *)
               ((long)&pNVar2[1].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar7 !=
        pNVar2[1].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = ppEVar7[-1]->rowIndex_ + 1;
      goto LAB_00172655;
    }
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_._0_4_ = 0;
    col4.super_Row_access_option.rows_._4_4_ = 0;
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
  }
  else {
LAB_00172655:
    col2.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,(long)(int)uVar10,
               (value_type_conflict1 *)&col2,(allocator_type *)&container_3);
    ppEVar3 = *(pointer *)
               ((long)&pNVar2[1].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    for (ppEVar7 = pNVar2[1].column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
        ppEVar7 = ppEVar7 + 1) {
      uVar1 = (*ppEVar7)->rowIndex_;
      if (uVar10 <= uVar1) break;
      *(uint *)(col4.super_Row_access_option._0_8_ + (ulong)uVar1 * 4) =
           ((*ppEVar7)->super_Entry_field_element_option).element_;
    }
  }
  sVar8 = CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_
                  ) - col4.super_Row_access_option._0_8_;
  if (sVar8 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if (CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_)
        == col4.super_Row_access_option._0_8_) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp((void *)col4.super_Row_access_option._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar12;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d82fe;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x20783e;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483a0;
  col2.super_Column_dimension_option.dim_ = 0x250128;
  col2._20_4_ = 0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_3;
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_b0,0x38f,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    CONCAT44(col4._20_4_,col4.super_Column_dimension_option.dim_) -
                    col4.super_Row_access_option._0_8_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x391);
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00248430;
  col4.super_Column_dimension_option.dim_ = 0x250128;
  col4._20_4_ = 0;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x201316;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppEVar7 = *(pointer *)
             ((long)&pNVar2[1].column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                     ._M_impl + 8);
  ppEVar3 = pNVar2[1].column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_340 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)((long)ppEVar7 - (long)ppEVar3 >> 3);
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)&local_440;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,ppEVar7 == ppEVar3);
  local_440 = (long *)((ulong)local_440._4_4_ << 0x20);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_bfd12;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x201afc;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_340;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483f0;
  col2.super_Column_dimension_option.dim_ = 0x250128;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_5;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002486b0;
  col3.super_Column_dimension_option.dim_ = 0x250128;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (&container_3,&col4,&container_4,0x391,1,2,2,"matrix[1].size()",&col2,"0",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  col2.super_Row_access_option.columnIndex_ = 4;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  _multiply_target_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),(Field_element *)&col2,&col1);
  col2.super_Column_dimension_option.dim_ = 0;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_._0_4_ = 4;
  col2.super_Row_access_option.rows_._4_4_ = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col2);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x397);
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    ppEVar7 = *(pointer *)
               ((long)&pNVar2[4].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar7 !=
        pNVar2[4].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = ppEVar7[-1]->rowIndex_ + 1;
      goto LAB_001729d8;
    }
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_._0_4_ = 0;
    col4.super_Row_access_option.rows_._4_4_ = 0;
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
  }
  else {
LAB_001729d8:
    col2.super_Row_access_option.columnIndex_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,(long)(int)uVar10,
               (value_type_conflict1 *)&col2,(allocator_type *)&container_3);
    ppEVar3 = *(pointer *)
               ((long)&pNVar2[4].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    for (ppEVar7 = pNVar2[4].column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
        ppEVar7 = ppEVar7 + 1) {
      uVar1 = (*ppEVar7)->rowIndex_;
      if (uVar10 <= uVar1) break;
      *(uint *)(col4.super_Row_access_option._0_8_ + (ulong)uVar1 * 4) =
           ((*ppEVar7)->super_Entry_field_element_option).element_;
    }
  }
  sVar8 = CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_
                  ) - col4.super_Row_access_option._0_8_;
  if (sVar8 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if (CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_)
        == col4.super_Row_access_option._0_8_) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp((void *)col4.super_Row_access_option._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar12;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d8325;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x207882;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483a0;
  col2.super_Column_dimension_option.dim_ = 0x250128;
  col2._20_4_ = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_3;
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_100,0x397,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    CONCAT44(col4._20_4_,col4.super_Column_dimension_option.dim_) -
                    col4.super_Row_access_option._0_8_);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x399);
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00248430;
  col4.super_Column_dimension_option.dim_ = 0x250128;
  col4._20_4_ = 0;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x201316;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)*(pointer *)
                 ((long)&pNVar2[4].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                         ._M_impl + 8) -
          *(long *)&pNVar2[4].column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data;
  local_340 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)(lVar9 >> 3);
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483f0;
  col2.super_Column_dimension_option.dim_ = 0x250128;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_5;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,lVar9 == 0x20);
  local_440._0_4_ = 4;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_bfd12;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x201afc;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_340;
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)&local_440;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002486b0;
  col3.super_Column_dimension_option.dim_ = 0x250128;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (&container_3,&col4,&container_4,0x399,1,2,2,"matrix[4].size()",&col2,"4",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 0;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  Naive_vector_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)&col2,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  col3.super_Row_access_option.columnIndex_ = 3;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  _multiply_source_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col2,(Field_element *)&col3);
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 1;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  col3.super_Row_access_option.columnIndex_ = 4;
  col3.super_Row_access_option._4_4_ = 2;
  col3.super_Row_access_option.rows_._0_4_ = 1;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col3);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x39f);
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    ppEVar7 = *(pointer *)
               ((long)&pNVar2[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar7 !=
        pNVar2[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = ppEVar7[-1]->rowIndex_ + 1;
      goto LAB_00172da1;
    }
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else {
LAB_00172da1:
    col3.super_Row_access_option.columnIndex_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&container_3,(long)(int)uVar10,(value_type_conflict1 *)&col3,
               (allocator_type *)&container_4);
    ppEVar3 = *(pointer *)
               ((long)&pNVar2[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    for (ppEVar7 = pNVar2[5].column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
        ppEVar7 = ppEVar7 + 1) {
      uVar1 = (*ppEVar7)->rowIndex_;
      if (uVar10 <= uVar1) break;
      container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] =
           ((*ppEVar7)->super_Entry_field_element_option).element_;
    }
  }
  sVar8 = (long)CONCAT44(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (uint)container_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish) -
          (long)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar8 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if ((pointer)CONCAT44(container_3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish._4_4_,
                          (uint)container_3.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish) ==
        container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar12;
  col4.super_Row_access_option.rows_._0_4_ = 0;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d833f;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2078c4;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483a0;
  col3.super_Column_dimension_option.dim_ = 0x250128;
  col3._20_4_ = 0;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_4;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_150,0x39f,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)container_3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x3a0);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00248430;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x250128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)*(pointer *)
                 ((long)&pNVar2[5].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                         ._M_impl + 8) -
          *(long *)&pNVar2[5].column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data;
  local_440 = (long *)(lVar9 >> 3);
  local_340 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)&local_348;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483f0;
  col3.super_Column_dimension_option.dim_ = 0x250128;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_330;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,lVar9 == 0x28);
  local_348 = (undefined4 *)CONCAT44(local_348._4_4_,5);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_bfd12;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x201afc;
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)&local_440;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002486b0;
  col4.super_Column_dimension_option.dim_ = 0x250128;
  col4._20_4_ = 0;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_340;
  boost::test_tools::tt_detail::report_assertion
            (&container_4,&container_3,&container_5,0x3a0,1,2,2,"matrix[5].size()",&col3,"5",&col4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  col4.super_Row_access_option.columnIndex_ = 0;
  col4.super_Row_access_option._4_4_ = 3;
  col4.super_Row_access_option.rows_._0_4_ = 2;
  col4.super_Row_access_option.rows_._4_4_ = 1;
  col4.super_Column_dimension_option.dim_ = 3;
  col4._20_4_ = 2;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 2;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000006;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&col4;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&container_3,__l_01,(allocator_type *)&container_4);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  Naive_vector_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)&col3,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&container_3,&settings);
  if (container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)container_3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  col4.super_Row_access_option.columnIndex_ = 3;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  _multiply_source_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col3,(Field_element *)&col4);
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 2;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  col4.super_Row_access_option.columnIndex_ = 3;
  col4.super_Row_access_option._4_4_ = 2;
  col4.super_Row_access_option.rows_._0_4_ = 4;
  col4.super_Row_access_option.rows_._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col4);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x3a5);
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    ppEVar7 = *(pointer *)
               ((long)&pNVar2[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar7 !=
        pNVar2[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = ppEVar7[-1]->rowIndex_ + 1;
      goto LAB_00173177;
    }
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
LAB_00173177:
    col4.super_Row_access_option.columnIndex_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&container_4,(long)(int)uVar10,(value_type_conflict1 *)&col4,
               (allocator_type *)&container_5);
    ppEVar3 = *(pointer *)
               ((long)&pNVar2[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    for (ppEVar7 = pNVar2[5].column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
        ppEVar7 = ppEVar7 + 1) {
      uVar1 = (*ppEVar7)->rowIndex_;
      if (uVar10 <= uVar1) break;
      container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] =
           ((*ppEVar7)->super_Entry_field_element_option).element_;
    }
  }
  if ((long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar12);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d833f;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2078c4;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483a0;
  col4.super_Column_dimension_option.dim_ = 0x250128;
  col4._20_4_ = 0;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&container_5;
  boost::test_tools::tt_detail::report_assertion(&container_3,&col4,&local_1a0,0x3a5,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x3a7);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00248430;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)*(pointer *)
                 ((long)&pNVar2[5].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                         ._M_impl + 8) -
          *(long *)&pNVar2[5].column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data;
  local_348 = (undefined4 *)(lVar9 >> 3);
  local_440 = &local_2d0;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002483f0;
  col4.super_Column_dimension_option.dim_ = 0x250128;
  col4._20_4_ = 0;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_340;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,lVar9 == 0x30);
  local_2d0 = CONCAT44(local_2d0._4_4_,6);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)0x201a89;
  local_328 = "";
  local_340 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)&local_348;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002486b0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x250128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  boost::test_tools::tt_detail::report_assertion
            (&container_5,&container_4,&local_330,0x3a7,1,2,2,"matrix[5].size()",&col4,"6",
             &container_3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000000;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  __l_02._M_len = 6;
  __l_02._M_array = (iterator)&container_3;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&container_4,__l_02,(allocator_type *)&container_5);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  Naive_vector_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)&col4,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&container_4,&settings);
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
  ::
  _multiply_target_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,false,false>>>*>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),(Field_element *)&container_3,&col4
            );
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000003;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 4;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&container_3);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x3ad);
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    ppEVar7 = *(pointer *)
               ((long)&pNVar2[3].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar7 ==
        pNVar2[3].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_001735cc;
    }
    uVar10 = ppEVar7[-1]->rowIndex_ + 1;
  }
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&container_5,(long)(int)uVar10,(value_type_conflict1 *)&container_3,
             (allocator_type *)&local_330);
  ppEVar3 = *(pointer *)
             ((long)&pNVar2[3].column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                     ._M_impl + 8);
  for (ppEVar7 = pNVar2[3].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
      ppEVar7 = ppEVar7 + 1) {
    uVar1 = (*ppEVar7)->rowIndex_;
    if (uVar10 <= uVar1) break;
    container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar1] =
         ((*ppEVar7)->super_Entry_field_element_option).element_;
  }
LAB_001735cc:
  if ((long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar12 = true;
    }
    else {
      iVar6 = bcmp(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar12 = iVar6 == 0;
    }
  }
  else {
    bVar12 = false;
  }
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar12);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)0x2078da;
  local_328 = "";
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002483a0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x250128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(&container_4,&container_3,&local_1f0,0x3ad,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_5.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_5.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3af);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00248430;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  pNVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)*(pointer *)
                 ((long)&pNVar2[3].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                         ._M_impl + 8) -
          *(long *)&pNVar2[3].column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data;
  local_2d0 = lVar9 >> 3;
  local_348 = &local_254;
  local_330 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)CONCAT71(local_330._1_7_,lVar9 == 0x30);
  local_254 = 6;
  local_328 = (char *)0x0;
  sStack_320.pi_ = (sp_counted_base *)0x0;
  local_340 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>
               *)0x201a89;
  local_338 = "";
  local_440 = &local_2d0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002483f0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x250128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002486b0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_320);
  ppEVar3 = col4.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar7 = col4.column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar3;
      ppEVar7 = ppEVar7 + 1) {
    pkVar4 = *ppEVar7;
    if ((long *)CONCAT44(col4.super_Row_access_option.rows_._4_4_,
                         (uint)col4.super_Row_access_option.rows_) != (long *)0x0) {
      p_Var11 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
                 *)((ulong)pkVar4->rowIndex_ * 0x30 +
                   *(long *)CONCAT44(col4.super_Row_access_option.rows_._4_4_,
                                     (uint)col4.super_Row_access_option.rows_));
      pVar13 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var11,pkVar4);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var11,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    }
    operator_delete(pkVar4,0xc);
  }
  ppEVar7 = col3.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (col4.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(col4.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)col4.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)col4.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppEVar7 = col3.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppEVar7 !=
         col3.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
    pkVar4 = *ppEVar7;
    if ((long *)CONCAT44(col3.super_Row_access_option.rows_._4_4_,
                         (uint)col3.super_Row_access_option.rows_) != (long *)0x0) {
      p_Var11 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
                 *)((ulong)pkVar4->rowIndex_ * 0x30 +
                   *(long *)CONCAT44(col3.super_Row_access_option.rows_._4_4_,
                                     (uint)col3.super_Row_access_option.rows_));
      pVar13 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var11,pkVar4);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var11,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    }
    operator_delete(pkVar4,0xc);
  }
  ppEVar7 = col2.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar3 = col2.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (col3.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(col3.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)col3.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)col3.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppEVar7 = col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar3 = col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppEVar5 = col2.column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      ppEVar3 !=
      col2.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    pkVar4 = *ppEVar3;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar7;
    if ((long *)CONCAT44(col2.super_Row_access_option.rows_._4_4_,
                         (uint)col2.super_Row_access_option.rows_) != (long *)0x0) {
      p_Var11 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
                 *)((ulong)pkVar4->rowIndex_ * 0x30 +
                   *(long *)CONCAT44(col2.super_Row_access_option.rows_._4_4_,
                                     (uint)col2.super_Row_access_option.rows_));
      pVar13 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var11,pkVar4);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var11,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    }
    operator_delete(pkVar4,0xc);
    ppEVar7 = col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar5;
  }
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar7;
  ppEVar3 = col1.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar5 = col1.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (col2.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(col2.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppEVar3 = col1.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar5 = col1.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppEVar7 = col1.column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      ppEVar5 !=
      col1.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
    pkVar4 = *ppEVar5;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar3;
    if ((long *)CONCAT44(col1.super_Row_access_option.rows_._4_4_,
                         (uint)col1.super_Row_access_option.rows_) != (long *)0x0) {
      p_Var11 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
                 *)((ulong)pkVar4->rowIndex_ * 0x30 +
                   *(long *)CONCAT44(col1.super_Row_access_option.rows_._4_4_,
                                     (uint)col1.super_Row_access_option.rows_));
      pVar13 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var11,pkVar4);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var11,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    }
    operator_delete(pkVar4,0xc);
    ppEVar3 = col1.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar7;
  }
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar3;
  ppEVar7 = col0.column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (col1.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(col1.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)col1.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)col1.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppEVar7 = col0.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppEVar7 !=
         col0.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
    pkVar4 = *ppEVar7;
    if (col0.super_Row_access_option.rows_ != (Row_container *)0x0) {
      p_Var11 = &((col0.super_Row_access_option.rows_)->
                 super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[pkVar4->rowIndex_]._M_t;
      pVar13 = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
               ::equal_range(p_Var11,pkVar4);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_>_>
      ::_M_erase_aux(p_Var11,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    }
    operator_delete(pkVar4,0xc);
  }
  if (col0.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(col0.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)col0.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)col0.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (settings.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(settings.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}